

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControl::drawContents(QWidgetTextControl *this,QPainter *p,QRectF *rect,QWidget *widget)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  PaintContext *pPVar4;
  long in_FS_OFFSET;
  byte bVar5;
  PaintContext ctx;
  PaintContext local_80;
  long local_30;
  
  bVar5 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save();
  puVar3 = &DAT_006e2d98;
  pPVar4 = &local_80;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pPVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pPVar4 = (PaintContext *)((long)pPVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  getPaintContext(&local_80,this,widget);
  if ((0.0 < rect->w) && (0.0 < rect->h)) {
    QPainter::setClipRect((QRectF *)p,(ClipOperation)rect);
  }
  local_80.clip.xp = rect->xp;
  local_80.clip.yp = rect->yp;
  local_80.clip.w = rect->w;
  local_80.clip.h = rect->h;
  plVar1 = (long *)QTextDocument::documentLayout();
  (**(code **)(*plVar1 + 0x60))(plVar1,p,&local_80);
  QPainter::restore();
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
            (&local_80.selections.d);
  QPalette::~QPalette(&local_80.palette);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::drawContents(QPainter *p, const QRectF &rect, QWidget *widget)
{
    Q_D(QWidgetTextControl);
    p->save();
    QAbstractTextDocumentLayout::PaintContext ctx = getPaintContext(widget);
    if (rect.isValid())
        p->setClipRect(rect, Qt::IntersectClip);
    ctx.clip = rect;

    d->doc->documentLayout()->draw(p, ctx);
    p->restore();
}